

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O1

bool try_parse<unsigned_long>(char *str,unsigned_long *res)

{
  uint uVar1;
  size_t sVar2;
  stringstream stream;
  ulong local_1a0 [2];
  long local_190 [2];
  uint auStack_180 [24];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  if (str == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_190 + (int)*(undefined8 *)(local_190[0] + -0x18));
  }
  else {
    sVar2 = strlen(str);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,str,sVar2);
  }
  *res = 0;
  std::istream::_M_extract<unsigned_long>(local_1a0);
  uVar1 = *(uint *)((long)auStack_180 + *(long *)(local_1a0[0] - 0x18));
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return (uVar1 & 7) == 2;
}

Assistant:

bool try_parse(const char *const str, T &res) {
  std::stringstream stream;
  stream << str;
  res = T{};
  stream >> res;
  return stream.eof() and not stream.fail();
}